

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

SharedMemoryArbiter * __thiscall
perfetto::TracingServiceImpl::ProducerEndpointImpl::MaybeSharedMemoryArbiter
          (ProducerEndpointImpl *this)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  char *fname;
  uint *puVar4;
  int *piVar5;
  char *pcVar6;
  pointer pSVar7;
  ProducerEndpointImpl *this_local;
  
  bVar3 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->inproc_shmem_arbiter_);
  if (!bVar3) {
    fname = perfetto::base::Basename
                      (
                      "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                      );
    puVar4 = (uint *)__errno_location();
    uVar1 = *puVar4;
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    perfetto::base::LogMessage
              (kLogError,fname,0xea75,
               "The in-process SharedMemoryArbiter can only be used when CreateProducer has been called with in_process=true and after tracing has started. (errno: %d, %s)"
               ,(ulong)uVar1,pcVar6);
    perfetto::base::MaybeSerializeLastLogsForCrashReporting();
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  pSVar7 = std::
           unique_ptr<perfetto::SharedMemoryArbiterImpl,_std::default_delete<perfetto::SharedMemoryArbiterImpl>_>
           ::get(&this->inproc_shmem_arbiter_);
  return &pSVar7->super_SharedMemoryArbiter;
}

Assistant:

SharedMemoryArbiter*
TracingServiceImpl::ProducerEndpointImpl::MaybeSharedMemoryArbiter() {
  if (!inproc_shmem_arbiter_) {
    PERFETTO_FATAL(
        "The in-process SharedMemoryArbiter can only be used when "
        "CreateProducer has been called with in_process=true and after tracing "
        "has started.");
  }

  PERFETTO_DCHECK(in_process_);
  return inproc_shmem_arbiter_.get();
}